

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void check_input<unsigned_int>(uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0)

{
  uint32_t *puVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  lcp_t lVar5;
  size_t i;
  ulong uVar6;
  
  for (uVar6 = 1; uVar6 < n0; uVar6 = uVar6 + 1) {
    cmp(from0[uVar6 - 1],from0[uVar6]);
  }
  uVar6 = 1;
  do {
    if (n0 <= uVar6) {
      uVar6 = 1;
      do {
        if (n0 <= uVar6) {
          uVar4 = get_char<unsigned_int>(*from0,0);
          if (uVar4 != *cache_input0) {
            __assert_fail("get_char<CharT>(*from0,0)==cache_input0[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x431,
                          "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                         );
          }
          uVar6 = 1;
          do {
            if (n0 <= uVar6) {
              return;
            }
            uVar4 = get_char<unsigned_int>(from0[uVar6],lcp_input0[uVar6 - 1]);
            puVar1 = cache_input0 + uVar6;
            uVar6 = uVar6 + 1;
          } while (uVar4 == *puVar1);
          __assert_fail("get_char<CharT>(from0[i],lcp_input0[i-1]) ==cache_input0[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x433,
                        "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                       );
        }
        lVar5 = lcp(from0[uVar6 - 1],from0[uVar6]);
        lVar2 = uVar6 - 1;
        uVar6 = uVar6 + 1;
      } while (lVar5 == lcp_input0[lVar2]);
      __assert_fail("lcp(from0[i-1],from0[i])==lcp_input0[i-1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x430,
                    "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                   );
    }
    iVar3 = cmp(from0[uVar6 - 1],from0[uVar6]);
    uVar6 = uVar6 + 1;
  } while (iVar3 < 1);
  __assert_fail("cmp(from0[i-1],from0[i])<=0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                ,0x42f,
                "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
               );
}

Assistant:

static void
check_input(unsigned char** from0, lcp_t* lcp_input0, CharT* cache_input0, size_t n0)
{
	(void) from0;
	(void) lcp_input0;
	(void) cache_input0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)if(lcp(from0[i-1],from0[i])!=lcp_input0[i-1]){
		debug()<<"Oops: "<<"lcp('"<<from0[i-1]<<"', '"<<from0[i]<<"')="
			<<lcp(from0[i-1],from0[i])<<" != "<<lcp_input0[i-1]<<"\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
	for(size_t i=1;i<n0;++i)assert(lcp(from0[i-1],from0[i])==lcp_input0[i-1]);
	assert(get_char<CharT>(*from0,0)==cache_input0[0]);
	for(size_t i=1;i<n0;++i)assert(get_char<CharT>(from0[i],lcp_input0[i-1])
			==cache_input0[i]);
#endif
}